

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

_Bool victim_tlb_hit(CPUArchState_conflict28 *env,size_t mmu_idx,size_t index,size_t elt_ofs,
                    target_ulong_conflict page)

{
  hwaddr hVar1;
  undefined4 uVar2;
  MemTxAttrs MVar3;
  undefined4 uVar4;
  CPUTLB_conflict5 *pCVar5;
  CPUTLBEntry *s;
  CPUTLBEntry *s_00;
  CPUIOTLBEntry *pCVar6;
  CPUIOTLBEntry *pCVar7;
  CPUIOTLBEntry *vio;
  CPUIOTLBEntry *io;
  CPUIOTLBEntry tmpio;
  CPUTLBEntry *tlb;
  CPUTLBEntry tmptlb;
  target_ulong_conflict cmp;
  CPUTLBEntry *vtlb;
  size_t vidx;
  target_ulong_conflict page_local;
  size_t elt_ofs_local;
  size_t index_local;
  size_t mmu_idx_local;
  CPUArchState_conflict28 *env_local;
  
  vtlb = (CPUTLBEntry *)0x0;
  while( true ) {
    if ((CPUTLBEntry *)0x7 < vtlb) {
      return false;
    }
    pCVar5 = env_tlb(env);
    s = pCVar5->d[mmu_idx].vtable + (long)vtlb;
    tmptlb.field_0._60_4_ = *(target_ulong_conflict *)((long)&s->field_0 + elt_ofs);
    if (tmptlb.field_0._60_4_ == page) break;
    vtlb = (CPUTLBEntry *)((long)&vtlb->field_0 + 1);
  }
  pCVar5 = env_tlb(env);
  s_00 = pCVar5->f[mmu_idx].table + index;
  copy_tlb_helper_locked((CPUTLBEntry *)&tlb,s_00);
  copy_tlb_helper_locked(s_00,s);
  copy_tlb_helper_locked(s,(CPUTLBEntry *)&tlb);
  pCVar5 = env_tlb(env);
  pCVar6 = pCVar5->d[mmu_idx].iotlb + index;
  pCVar5 = env_tlb(env);
  pCVar7 = pCVar5->d[mmu_idx].viotlb + (long)vtlb;
  hVar1 = pCVar6->addr;
  MVar3 = pCVar6->attrs;
  uVar4 = *(undefined4 *)&pCVar6->field_0xc;
  pCVar6->addr = pCVar7->addr;
  uVar2 = *(undefined4 *)&pCVar7->field_0xc;
  pCVar6->attrs = pCVar7->attrs;
  *(undefined4 *)&pCVar6->field_0xc = uVar2;
  pCVar7->addr = hVar1;
  pCVar7->attrs = MVar3;
  *(undefined4 *)&pCVar7->field_0xc = uVar4;
  return true;
}

Assistant:

static bool victim_tlb_hit(CPUArchState *env, size_t mmu_idx, size_t index,
                           size_t elt_ofs, target_ulong page)
{
    size_t vidx;

    // assert_cpu_is_self(env_cpu(env));
    for (vidx = 0; vidx < CPU_VTLB_SIZE; ++vidx) {
        CPUTLBEntry *vtlb = &env_tlb(env)->d[mmu_idx].vtable[vidx];
        target_ulong cmp;

#if TCG_OVERSIZED_GUEST
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#else
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#endif

        if (cmp == page) {
            /* Found entry in victim tlb, swap tlb and iotlb.  */
            CPUTLBEntry tmptlb, *tlb = &env_tlb(env)->f[mmu_idx].table[index];

            copy_tlb_helper_locked(&tmptlb, tlb);
            copy_tlb_helper_locked(tlb, vtlb);
            copy_tlb_helper_locked(vtlb, &tmptlb);

            CPUIOTLBEntry tmpio, *io = &env_tlb(env)->d[mmu_idx].iotlb[index];
            CPUIOTLBEntry *vio = &env_tlb(env)->d[mmu_idx].viotlb[vidx];
            tmpio = *io; *io = *vio; *vio = tmpio;
            return true;
        }
    }
    return false;
}